

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.hxx
# Opt level: O2

void __thiscall nuraft::stat_elem::reset(stat_elem *this)

{
  Histogram empty_histogram;
  Histogram local_40;
  
  if (this->stat_type_ == HISTOGRAM) {
    Histogram::Histogram(&local_40,2.0);
    Histogram::operator=(this->hist_,&local_40);
    Histogram::~Histogram(&local_40);
  }
  return;
}

Assistant:

void reset() {
        switch (stat_type_) {
        case COUNTER:
        case GAUGE:
            set(0);
            break;
        case HISTOGRAM: {
            Histogram empty_histogram;
            *hist_ = empty_histogram;
            break; }
        default: break;
        }
    }